

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

GeoSegment * geopolySegmentMerge(GeoSegment *pLeft,GeoSegment *pRight)

{
  GeoSegment *pGVar1;
  GeoSegment *pGVar2;
  long in_FS_OFFSET;
  bool bVar3;
  double dVar4;
  undefined1 auStack_38 [36];
  undefined4 local_14;
  GeoSegment *local_10;
  long local_8;
  
  pGVar1 = (GeoSegment *)auStack_38;
  pGVar2 = (GeoSegment *)auStack_38;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  auStack_38._16_4_ = 0xffffffff;
  auStack_38._20_4_ = 0xffffffff;
  auStack_38._24_4_ = -NAN;
  auStack_38._0_4_ = 0xffffffff;
  auStack_38._4_4_ = 0xffffffff;
  auStack_38._8_4_ = 0xffffffff;
  auStack_38._12_4_ = 0xffffffff;
  auStack_38._28_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_14 = 0xaaaaaaaa;
  local_10 = (GeoSegment *)0x0;
  bVar3 = pRight != (GeoSegment *)0x0;
  if (pLeft != (GeoSegment *)0x0 && bVar3) {
    do {
      dVar4 = pRight->y - pLeft->y;
      if ((dVar4 == 0.0) && (!NAN(dVar4))) {
        dVar4 = pRight->C - pLeft->C;
      }
      if (0.0 <= dVar4) {
        pGVar1->pNext = pLeft;
        pGVar2 = pLeft;
        pLeft = pLeft->pNext;
      }
      else {
        pGVar1->pNext = pRight;
        pGVar2 = pRight;
        pRight = pRight->pNext;
      }
      bVar3 = pRight != (GeoSegment *)0x0;
    } while ((bVar3) && (pGVar1 = pGVar2, pLeft != (GeoSegment *)0x0));
  }
  if (bVar3) {
    pLeft = pRight;
  }
  pGVar2->pNext = pLeft;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

static GeoSegment *geopolySegmentMerge(GeoSegment *pLeft, GeoSegment *pRight){
  GeoSegment head, *pLast;
  head.pNext = 0;
  pLast = &head;
  while( pRight && pLeft ){
    double r = pRight->y - pLeft->y;
    if( r==0.0 ) r = pRight->C - pLeft->C;
    if( r<0.0 ){
      pLast->pNext = pRight;
      pLast = pRight;
      pRight = pRight->pNext;
    }else{
      pLast->pNext = pLeft;
      pLast = pLeft;
      pLeft = pLeft->pNext;
    }
  }
  pLast->pNext = pRight ? pRight : pLeft;
  return head.pNext;
}